

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O2

void restore_attrib(void)

{
  schar sVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  
  for (lVar4 = -6; lVar4 != 0; lVar4 = lVar4 + 1) {
    cVar3 = u.atime.a[lVar4];
    if ((((cVar3 != '\0') && (*(char *)((long)(&u.atime + 1) + lVar4) != '\0')) &&
        (cVar2 = *(char *)((long)(&u.atime + 1) + lVar4) + -1,
        *(char *)((long)(&u.atime + 1) + lVar4) = cVar2, cVar2 == '\0')) &&
       (cVar3 = (-('\0' < cVar3) | 1U) + cVar3, u.atime.a[lVar4] = cVar3, cVar3 != '\0')) {
      sVar1 = acurr(4);
      *(char *)((long)(&u.atime + 1) + lVar4) = (char)(100 / (short)sVar1);
    }
  }
  encumber_msg();
  return;
}

Assistant:

void restore_attrib(void)
{
	int	i;

	for (i = 0; i < A_MAX; i++) {	/* all temporary losses/gains */

	   if (ATEMP(i) && ATIME(i)) {
		if (!(--(ATIME(i)))) { /* countdown for change */
		    ATEMP(i) += ATEMP(i) > 0 ? -1 : 1;

		    if (ATEMP(i)) /* reset timer */
			ATIME(i) = 100 / ACURR(A_CON);
		}
	    }
	}
	encumber_msg();
}